

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::banPlayer(Server *this,int id,string_view banner,string_view reason)

{
  PlayerInfo *player;
  string_view text;
  string_view str;
  string out_reason;
  string local_70;
  string local_50;
  
  str._M_str = banner._M_str;
  if (this->m_rconBan == true) {
    str._M_len = (size_t)reason._M_str;
    escapifyRCON_abi_cxx11_(&local_50,(RenX *)reason._M_len,str);
    string_printf_abi_cxx11_
              (&local_70,"ckickban pid%d %.*s\n",id,local_50._M_string_length,
               local_50._M_dataplus._M_p);
    text._M_str = local_70._M_dataplus._M_p;
    text._M_len = local_70._M_string_length;
    sendSocket(this,text);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    player = getPlayer(this,id);
    if (player != (PlayerInfo *)0x0) {
      banPlayer(this,player,banner,reason,(seconds)0x0);
    }
  }
  return;
}

Assistant:

void RenX::Server::banPlayer(int id, std::string_view banner, std::string_view reason) {
	if (m_rconBan) {
		std::string out_reason = RenX::escapifyRCON(reason);
		sendSocket(string_printf("ckickban pid%d %.*s\n", id, out_reason.size(), out_reason.data()));
	}
	else {
		RenX::PlayerInfo *player = getPlayer(id);
		if (player != nullptr) {
			banPlayer(*player, banner, reason);
		}
	}
}